

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O1

int __thiscall
AbstractModuleClient::processNotification
          (AbstractModuleClient *this,char *param_1,string *noteType,TrodesMsg *msg)

{
  bool bVar1;
  int iVar2;
  binarydata configdata;
  string who;
  string local_e8;
  undefined1 local_c8 [56];
  string local_90;
  string local_70;
  TrodesConfig local_50;
  
  iVar2 = std::__cxx11::string::compare((char *)noteType);
  if (iVar2 == 0) {
    TrodesConfig::TrodesConfig((TrodesConfig *)local_c8);
    binarydata::binarydata((binarydata *)&local_e8);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"n","");
    TrodesMsg::popcontents<binarydata>(msg,&local_70,(binarydata *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    TrodesConfig::decode((TrodesConfig *)local_c8,(binarydata *)&local_e8);
    TrodesConfig::TrodesConfig(&local_50,(TrodesConfig *)local_c8);
    MlmWrap::setTrodesConfig(&this->super_MlmWrap,&local_50);
    TrodesConfig::~TrodesConfig(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    TrodesConfig::~TrodesConfig((TrodesConfig *)local_c8);
    return 0;
  }
  iVar2 = std::__cxx11::string::compare((char *)noteType);
  if (iVar2 == 0) {
    TrodesMsg::popstr_abi_cxx11_((string *)local_c8,msg);
    bVar1 = subToTimestamps(this,(string *)local_c8);
    if (!bVar1) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Could not properly register timestamps socket!\n","");
      MlmWrap::error(&local_e8,&this->super_MlmWrap,&local_90);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,local_e8._M_dataplus._M_p,local_e8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)noteType);
    if (iVar2 == 0) {
      unsubToTimestamps(this);
      return 0;
    }
    iVar2 = std::__cxx11::string::compare((char *)noteType);
    if (iVar2 != 0) {
      return 0;
    }
    TrodesMsg::popstr_abi_cxx11_((string *)local_c8,msg);
    network_pimpl::remove_client((this->super_MlmWrap).state,(string *)local_c8);
  }
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  return 0;
}

Assistant:

int AbstractModuleClient::processNotification(const char *, std::string noteType, TrodesMsg &msg) {
    int rc = 0;
//    std::cout << "AMC::processNotification: " << noteType << "\n";
    if (noteType == NOTE_CONFIG_CHANGED) {
        TrodesConfig newConfig;
        binarydata configdata;
        msg.popcontents("n", configdata);
        newConfig.decode(configdata);
        setTrodesConfig(newConfig);
    }
    else if(noteType == "TIMESTAMP_ADDRESS"){
        std::string addr = msg.popstr();
//        std::cout << "----address: |" << addr << "|\n";
        if(!subToTimestamps(addr)){
            std::cerr << error("Could not properly register timestamps socket!\n");
        }
    }
    else if(noteType == "TIMESTAMP_ADDRESS_DEREG"){
        //dereg timestamp
        if(!unsubToTimestamps()){
            std::cerr << error("Could not properly de-register timestamps socket!\n");
        }
    }
    else if(noteType == CLIENT_EXPIRED_MSG){
        auto const who = msg.popstr();
        state->remove_client(who);
    }
    // else{
    //     std::cout << "[AMC]: Notification type [" << noteType << "] not recognized.\n";
    // }
    return rc;
}